

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

int __thiscall QOpenGLShaderProgram::link(QOpenGLShaderProgram *this,char *__from,char *__to)

{
  bool bVar1;
  GLuint GVar2;
  QOpenGLShaderProgramPrivate *pQVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  GLuint program;
  QOpenGLShaderProgramPrivate *d;
  QString name;
  GLint len;
  char *logbuf;
  GLint value;
  GLenum in_stack_fffffffffffffef8;
  GLuint in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  char **in_stack_ffffffffffffff08;
  QByteArrayView *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  bool local_b9;
  char local_b8 [32];
  char local_98 [32];
  QString local_78;
  storage_type *local_60;
  undefined1 local_50 [28];
  undefined4 local_34;
  void *local_30;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QOpenGLShaderProgram *)0x174300);
  if (pQVar3->programGuard == (QOpenGLSharedResourceGuard *)0x0) {
    GVar2 = 0;
  }
  else {
    GVar2 = QOpenGLSharedResourceGuard::id(pQVar3->programGuard);
  }
  if (GVar2 == 0) {
    local_b9 = false;
  }
  else if ((((pQVar3->linkBinaryRecursion & 1U) != 0) ||
           (bVar1 = QList<QOpenGLShader_*>::isEmpty((QList<QOpenGLShader_*> *)0x174365), !bVar1)) ||
          (bVar1 = QList<QOpenGLProgramBinaryCache::ShaderDesc>::isEmpty
                             ((QList<QOpenGLProgramBinaryCache::ShaderDesc> *)0x17437c), bVar1)) {
    local_c = -0x55555556;
    bVar1 = QList<QOpenGLShader_*>::isEmpty((QList<QOpenGLShader_*> *)0x1743b1);
    if (bVar1) {
      local_c = 0;
      QOpenGLFunctions::glGetProgramiv
                ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,(GLint *)0x1743e4);
      pQVar3->linked = local_c != 0;
      if ((pQVar3->linked & 1U) != 0) {
        local_b9 = true;
        goto LAB_001746dc;
      }
    }
    QOpenGLFunctions::glLinkProgram
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    local_c = 0;
    QOpenGLFunctions::glGetProgramiv
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,(GLint *)0x174459);
    pQVar3->linked = local_c != 0;
    local_c = 0;
    QOpenGLFunctions::glGetProgramiv
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,(GLint *)0x17449f);
    QString::QString((QString *)0x1744ac);
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QString::~QString((QString *)0x1744d2);
    if (1 < local_c) {
      local_30 = operator_new__((long)local_c);
      local_34 = 0xaaaaaaaa;
      QOpenGLFunctions::glGetProgramInfoLog
                ((QOpenGLFunctions *)in_stack_ffffffffffffff10,
                 (GLuint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (GLsizei)in_stack_ffffffffffffff08,
                 (GLsizei *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QByteArrayView::QByteArrayView<char_*,_true>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      QVar6.m_data = local_60;
      QVar6.m_size = (qsizetype)local_50;
      QString::fromLatin1(QVar6);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x174584);
      if (((pQVar3->linked & 1U) == 0) && ((pQVar3->linkBinaryRecursion & 1U) == 0)) {
        local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_78.d.size = -0x5555555555555556;
        QObject::objectName();
        bVar1 = QString::isEmpty((QString *)0x1745f4);
        if (bVar1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff04,
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QtPrivate::asString(&pQVar3->log);
          uVar4 = QString::utf16();
          QMessageLogger::warning(local_98,"QOpenGLShader::link: %ls",uVar4);
        }
        else {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff04,
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QtPrivate::asString(&local_78);
          uVar4 = QString::utf16();
          QtPrivate::asString(&pQVar3->log);
          uVar5 = QString::utf16();
          QMessageLogger::warning(local_b8,"QOpenGLShader::link[%ls]: %ls",uVar4,uVar5);
        }
        QString::~QString((QString *)0x1746ac);
      }
      if (local_30 != (void *)0x0) {
        operator_delete__(local_30);
      }
    }
    local_b9 = (bool)(pQVar3->linked & 1);
  }
  else {
    local_b9 = QOpenGLShaderProgramPrivate::linkBinary
                         ((QOpenGLShaderProgramPrivate *)CONCAT44(GVar2,in_stack_ffffffffffffff18));
  }
LAB_001746dc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_b9);
}

Assistant:

bool QOpenGLShaderProgram::link()
{
    Q_D(QOpenGLShaderProgram);
    GLuint program = d->programGuard ? d->programGuard->id() : 0;
    if (!program)
        return false;

    if (!d->linkBinaryRecursion && d->shaders.isEmpty() && !d->binaryProgram.shaders.isEmpty())
        return d->linkBinary();

    GLint value;
    if (d->shaders.isEmpty()) {
        // If there are no explicit shaders, then it is possible that the
        // application added a program binary with glProgramBinaryOES(), or
        // otherwise populated the shaders itself. This is also the case when
        // we are recursively called back from linkBinary() after a successful
        // glProgramBinary(). Check to see if the program is already linked and
        // bail out if so.
        value = 0;
        d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
        d->linked = (value != 0);
        if (d->linked)
            return true;
    }

    d->glfuncs->glLinkProgram(program);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
    d->linked = (value != 0);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_INFO_LOG_LENGTH, &value);
    d->log = QString();
    if (value > 1) {
        char *logbuf = new char [value];
        GLint len;
        d->glfuncs->glGetProgramInfoLog(program, value, &len, logbuf);
        d->log = QString::fromLatin1(logbuf);
        if (!d->linked && !d->linkBinaryRecursion) {
            QString name = objectName();
            if (name.isEmpty())
                qWarning("QOpenGLShader::link: %ls", qUtf16Printable(d->log));
            else
                qWarning("QOpenGLShader::link[%ls]: %ls", qUtf16Printable(name), qUtf16Printable(d->log));
        }
        delete [] logbuf;
    }
    return d->linked;
}